

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O3

bean_ptr<WrappedBytes> *
hiberlite::Registry<WrappedBytes>::createBeanPtr
          (bean_ptr<WrappedBytes> *__return_storage_ptr__,bean_key *key,WrappedBytes *obj)

{
  long lVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  int iVar3;
  real_bean<WrappedBytes> *prVar4;
  shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *psVar5;
  iterator iVar6;
  mapped_type *pprVar7;
  logic_error *this;
  
  lVar1 = key->id;
  if (lVar1 == -1) {
    psVar2 = (key->con).res;
    if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).
      _vptr_shared_res = (_func_int **)&PTR__shared_res_001d3828;
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res =
           (shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)0x0;
      return __return_storage_ptr__;
    }
    iVar3 = psVar2->refCount;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>)._vptr_shared_res
         = (_func_int **)&PTR__shared_res_001d3828;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res =
         (shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)0x0;
  }
  else {
    prVar4 = (real_bean<WrappedBytes> *)operator_new(0x28);
    psVar2 = (key->con).res;
    if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (prVar4->key).id = lVar1;
      (prVar4->key).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      (prVar4->key).con.res = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
      prVar4->obj = obj;
      prVar4->forgotten = false;
    }
    else {
      iVar3 = psVar2->refCount;
      (prVar4->key).id = lVar1;
      (prVar4->key).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      (prVar4->key).con.res = psVar2;
      prVar4->obj = obj;
      prVar4->forgotten = false;
      iVar3 = iVar3 + 1;
      psVar2->refCount = iVar3;
      if (iVar3 == 0) {
        (*psVar2->_vptr_shared_cnt_obj_pair[1])();
      }
    }
    psVar5 = (shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)operator_new(0x18);
    psVar5->res = prVar4;
    psVar5->refCount = 0;
    ((shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)&psVar5->_vptr_shared_cnt_obj_pair)
    ->_vptr_shared_cnt_obj_pair = (_func_int **)&PTR__rb_pair_001d3890;
    iVar6 = std::
            _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
            ::find((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
                    *)rbpairs,key);
    if (iVar6._M_node != (_Base_ptr)(rbpairs + 8)) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"bean already exists");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pprVar7 = std::
              map<hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
              ::operator[]((map<hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
                            *)rbpairs,key);
    *pprVar7 = (mapped_type)psVar5;
    psVar2 = (key->con).res;
    if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).
      _vptr_shared_res = (_func_int **)&PTR__shared_res_001d3828;
      (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res = psVar5;
      psVar5->refCount = 1;
      return __return_storage_ptr__;
    }
    iVar3 = psVar2->refCount;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>)._vptr_shared_res
         = (_func_int **)&PTR__shared_res_001d3828;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res = psVar5;
    psVar5->refCount = 1;
    psVar2->refCount = iVar3;
  }
  if (iVar3 == 0) {
    (*psVar2->_vptr_shared_cnt_obj_pair[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::createBeanPtr(bean_key key, C* obj)
{
	if(key.id==Database::NULL_ID)
		return bean_ptr<C>(key,NULL);

	real_bean<C>* rb=new real_bean<C>(key,obj);
	rb_pair<C>* para=new rb_pair<C>(rb);

	if( rbpairs.find(key)!=rbpairs.end() )
		throw std::logic_error("bean already exists");

	rbpairs[key]=para;

	bean_ptr<C> ans(key, para);
	return ans;
}